

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScript.c
# Opt level: O3

Gia_Man_t * Gia_ManAigSyn4(Gia_Man_t *p,int fVerbose,int fVeryVerbose)

{
  Gia_Man_t *pGVar1;
  Gia_Man_t *pGVar2;
  Jf_Par_t *pPars;
  Jf_Par_t Pars;
  Jf_Par_t local_128;
  
  Jf_ManSetDefaultPars(&local_128);
  local_128.nRelaxRatio = 0x28;
  if (fVerbose != 0) {
    Gia_ManPrintStats(p,(Gps_Par_t *)0x0);
  }
  if (p->nObjs == p->vCis->nSize + p->vCos->nSize + 1) {
    pGVar1 = Gia_ManDup(p);
  }
  else {
    pGVar1 = Gia_ManAreaBalance(p,0,1000000000,fVeryVerbose,0);
    if (fVerbose == 0) {
      local_128.nLutSize = 7;
      pGVar1 = Jf_ManPerformMapping(pGVar1,&local_128);
      pGVar2 = Gia_ManPerformFx(pGVar1,1000000000,0,0,fVeryVerbose,0);
    }
    else {
      Gia_ManPrintStats(pGVar1,(Gps_Par_t *)0x0);
      local_128.nLutSize = 7;
      pGVar1 = Jf_ManPerformMapping(pGVar1,&local_128);
      Gia_ManPrintStats(pGVar1,(Gps_Par_t *)0x0);
      pGVar2 = Gia_ManPerformFx(pGVar1,1000000000,0,0,fVeryVerbose,0);
      Gia_ManPrintStats(pGVar2,(Gps_Par_t *)0x0);
    }
    Gia_ManStop(pGVar1);
    pGVar1 = Gia_ManAreaBalance(pGVar2,0,1000000000,fVeryVerbose,0);
    if (fVerbose != 0) {
      Gia_ManPrintStats(pGVar1,(Gps_Par_t *)0x0);
    }
    Gia_ManStop(pGVar2);
    local_128.nLutSize = 5;
    pGVar1 = Jf_ManPerformMapping(pGVar1,&local_128);
    if (fVerbose == 0) {
      pGVar2 = Gia_ManPerformFx(pGVar1,1000000000,0,0,fVeryVerbose,0);
    }
    else {
      Gia_ManPrintStats(pGVar1,(Gps_Par_t *)0x0);
      pGVar2 = Gia_ManPerformFx(pGVar1,1000000000,0,0,fVeryVerbose,0);
      Gia_ManPrintStats(pGVar2,(Gps_Par_t *)0x0);
    }
    Gia_ManStop(pGVar1);
    pGVar1 = Gia_ManAreaBalance(pGVar2,0,1000000000,fVeryVerbose,0);
    if (fVerbose != 0) {
      Gia_ManPrintStats(pGVar1,(Gps_Par_t *)0x0);
    }
    Gia_ManStop(pGVar2);
  }
  return pGVar1;
}

Assistant:

Gia_Man_t * Gia_ManAigSyn4( Gia_Man_t * p, int fVerbose, int fVeryVerbose )
{
    Gia_Man_t * pNew, * pTemp;
    Jf_Par_t Pars, * pPars = &Pars;
    Jf_ManSetDefaultPars( pPars );
    pPars->nRelaxRatio = 40;
    if ( fVerbose )     Gia_ManPrintStats( p, NULL );
    if ( Gia_ManAndNum(p) == 0 )
        return Gia_ManDup(p);
//Gia_ManAigPrintPiLevels( p );
    // perform balancing
    pNew = Gia_ManAreaBalance( p, 0, ABC_INFINITY, fVeryVerbose, 0 );
    if ( fVerbose )     Gia_ManPrintStats( pNew, NULL );
    // perform mapping
    pPars->nLutSize = 7;
    pNew = Jf_ManPerformMapping( pTemp = pNew, pPars );
    if ( fVerbose )     Gia_ManPrintStats( pNew, NULL );
//    Gia_ManStop( pTemp );
    // perform extraction
    pNew = Gia_ManPerformFx( pTemp = pNew, ABC_INFINITY, 0, 0, fVeryVerbose, 0 );
    if ( fVerbose )     Gia_ManPrintStats( pNew, NULL );
    Gia_ManStop( pTemp );
    // perform balancing
    pNew = Gia_ManAreaBalance( pTemp = pNew, 0, ABC_INFINITY, fVeryVerbose, 0 );
    if ( fVerbose )     Gia_ManPrintStats( pNew, NULL );
    Gia_ManStop( pTemp );
    // perform mapping
    pPars->nLutSize = 5;
    pNew = Jf_ManPerformMapping( pTemp = pNew, pPars );
    if ( fVerbose )     Gia_ManPrintStats( pNew, NULL );
//    Gia_ManStop( pTemp );
    // perform extraction
    pNew = Gia_ManPerformFx( pTemp = pNew, ABC_INFINITY, 0, 0, fVeryVerbose, 0 );
    if ( fVerbose )     Gia_ManPrintStats( pNew, NULL );
    Gia_ManStop( pTemp );
    // perform balancing
    pNew = Gia_ManAreaBalance( pTemp = pNew, 0, ABC_INFINITY, fVeryVerbose, 0 );
    if ( fVerbose )     Gia_ManPrintStats( pNew, NULL );
    Gia_ManStop( pTemp );
//Gia_ManAigPrintPiLevels( pNew );
    return pNew;
}